

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  FT_Byte *limit;
  FT_Byte FVar1;
  bool bVar2;
  FT_Byte *pFVar3;
  FT_Int FVar4;
  FT_Fixed FVar5;
  long lVar6;
  FT_Byte *local_38;
  
  ps_parser_skip_spaces(parser);
  limit = parser->limit;
  local_38 = parser->cursor;
  FVar4 = 0;
  if (limit <= local_38) goto LAB_001f1720;
  if (*local_38 == '[') {
    FVar1 = ']';
LAB_001f167e:
    local_38 = local_38 + 1;
    bVar2 = false;
  }
  else {
    if (*local_38 == '{') {
      FVar1 = '}';
      goto LAB_001f167e;
    }
    FVar1 = '\0';
    bVar2 = true;
  }
  lVar6 = 0;
  do {
    if ((limit <= local_38) || (skip_spaces(&local_38,limit), pFVar3 = local_38, limit <= local_38))
    break;
    if (FVar1 == *local_38) {
      local_38 = local_38 + 1;
      break;
    }
    if (max_coords <= lVar6 && coords != (FT_Short *)0x0) break;
    FVar5 = PS_Conv_ToFixed(&local_38,limit,0);
    if (coords != (FT_Short *)0x0) {
      coords[lVar6] = (FT_Short)((ulong)FVar5 >> 0x10);
    }
    if (pFVar3 == local_38) {
      FVar4 = -1;
      goto LAB_001f1720;
    }
    lVar6 = lVar6 + 1;
  } while (!bVar2);
  FVar4 = (FT_Int)lVar6;
LAB_001f1720:
  parser->cursor = local_38;
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }